

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_storage.cpp
# Opt level: O2

file_index_t __thiscall
libtorrent::file_storage::file_index_at_offset(file_storage *this,int64_t offset)

{
  pointer pfVar1;
  __normal_iterator<const_libtorrent::aux::file_entry_*,_std::vector<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>_>
  _Var2;
  file_entry local_30;
  
  local_30._8_8_ = 0xfff000000000000;
  local_30.name = (char *)0x0;
  local_30.root = (char *)0x0;
  local_30.path_index.m_val = 0x3fffffff;
  local_30._0_8_ = offset & 0xffffffffffffU | 0x7fff000000000000;
  _Var2 = ::std::
          __upper_bound<__gnu_cxx::__normal_iterator<libtorrent::aux::file_entry_const*,std::vector<libtorrent::aux::file_entry,std::allocator<libtorrent::aux::file_entry>>>,libtorrent::aux::file_entry,__gnu_cxx::__ops::_Val_comp_iter<bool(*)(libtorrent::aux::file_entry_const&,libtorrent::aux::file_entry_const&)>>
                    ((this->m_files).
                     super_vector<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>
                     .
                     super__Vector_base<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->m_files).
                     super_vector<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>
                     .
                     super__Vector_base<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_30,
                     (_Val_comp_iter<bool_(*)(const_libtorrent::aux::file_entry_&,_const_libtorrent::aux::file_entry_&)>
                      )0x1acd6d);
  pfVar1 = (this->m_files).
           super_vector<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>.
           super__Vector_base<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  aux::file_entry::~file_entry(&local_30);
  return (file_index_t)(int)(((long)_Var2._M_current + (-0x28 - (long)pfVar1)) / 0x28);
}

Assistant:

file_index_t file_storage::file_index_at_offset(std::int64_t const offset) const
	{
		TORRENT_ASSERT_PRECOND(offset >= 0);
		TORRENT_ASSERT_PRECOND(offset < m_total_size);
		TORRENT_ASSERT(offset <= max_file_offset);
		// find the file iterator and file offset
		aux::file_entry target;
		target.offset = aux::numeric_cast<std::uint64_t>(offset);
		TORRENT_ASSERT(!compare_file_offset(target, m_files.front()));

		auto file_iter = std::upper_bound(
			m_files.begin(), m_files.end(), target, compare_file_offset);

		TORRENT_ASSERT(file_iter != m_files.begin());
		--file_iter;
		return file_index_t{int(file_iter - m_files.begin())};
	}